

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

Context * __thiscall aeron::archive::Context::controlRequestChannel(Context *this,string *value)

{
  string local_138;
  string local_118;
  string local_f8;
  string local_c8;
  undefined1 local_a8 [8];
  ChannelUri uri;
  string *value_local;
  Context *this_local;
  
  uri.tags_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = value;
  ChannelUri::parse((ChannelUri *)local_a8,value);
  std::__cxx11::to_string(&local_c8,(this->cfg_).controlTermBufferLength);
  ChannelUri::put((ChannelUri *)local_a8,
                  (string *)(anonymous_namespace)::TERM_LENGTH_PARAM_NAME_abi_cxx11_,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::to_string(&local_f8,(this->cfg_).controlMtuLength);
  ChannelUri::put((ChannelUri *)local_a8,
                  (string *)(anonymous_namespace)::MTU_LENGTH_PARAM_NAME_abi_cxx11_,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::to_string(&local_118,(this->cfg_).controlTermBufferSparse & 1);
  ChannelUri::put((ChannelUri *)local_a8,
                  (string *)(anonymous_namespace)::SPARSE_PARAM_NAME_abi_cxx11_,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  ChannelUri::toString_abi_cxx11_(&local_138,(ChannelUri *)local_a8);
  std::__cxx11::string::operator=((string *)&this->controlRequestChannel_,(string *)&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  ChannelUri::~ChannelUri((ChannelUri *)local_a8);
  return this;
}

Assistant:

Context& Context::controlRequestChannel(const std::string& value) {
    ChannelUri uri = ChannelUri::parse(value);
    uri.put(TERM_LENGTH_PARAM_NAME, std::to_string(cfg_.controlTermBufferLength));
    uri.put(MTU_LENGTH_PARAM_NAME, std::to_string(cfg_.controlMtuLength));
    uri.put(SPARSE_PARAM_NAME, std::to_string(cfg_.controlTermBufferSparse));
    controlRequestChannel_ = uri.toString();
    return *this;
}